

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O2

void PVG_FT_Vector_Rotate(PVG_FT_Vector *vec,PVG_FT_Angle angle)

{
  PVG_FT_Int PVar1;
  PVG_FT_Fixed s;
  byte bVar2;
  PVG_FT_Fixed s_1;
  long lVar3;
  long lVar4;
  long lVar5;
  PVG_FT_Vector local_38;
  
  local_38.x = vec->x;
  local_38.y = vec->y;
  if (local_38.y != 0 || local_38.x != 0) {
    PVar1 = ft_trig_prenorm(&local_38);
    ft_trig_pseudo_rotate(&local_38,angle);
    lVar3 = -local_38.x;
    if (0 < local_38.x) {
      lVar3 = local_38.x;
    }
    lVar5 = lVar3 * 0xdbd95b16 + 0x100000000 >> 0x20;
    lVar3 = -lVar5;
    if (-1 < local_38.x) {
      lVar3 = lVar5;
    }
    lVar5 = -local_38.y;
    if (0 < local_38.y) {
      lVar5 = local_38.y;
    }
    lVar4 = lVar5 * 0xdbd95b16 + 0x100000000 >> 0x20;
    lVar5 = -lVar4;
    if (-1 < local_38.y) {
      lVar5 = lVar4;
    }
    bVar2 = (byte)PVar1;
    if (PVar1 < 1) {
      vec->x = lVar3 << (-bVar2 & 0x3f);
      lVar5 = lVar5 << (-bVar2 & 0x3f);
    }
    else {
      lVar4 = (long)(1 << (bVar2 - 1 & 0x1f));
      vec->x = (lVar3 >> 0x3f) + lVar3 + lVar4 >> (bVar2 & 0x3f);
      lVar5 = (lVar5 >> 0x3f) + lVar4 + lVar5 >> (bVar2 & 0x3f);
    }
    vec->y = lVar5;
  }
  return;
}

Assistant:

void PVG_FT_Vector_Rotate(PVG_FT_Vector* vec, PVG_FT_Angle angle)
{
    PVG_FT_Int     shift;
    PVG_FT_Vector  v = *vec;

    if ( v.x == 0 && v.y == 0 )
        return;

    shift = ft_trig_prenorm( &v );
    ft_trig_pseudo_rotate( &v, angle );
    v.x = ft_trig_downscale( v.x );
    v.y = ft_trig_downscale( v.y );

    if ( shift > 0 )
    {
        PVG_FT_Int32  half = (PVG_FT_Int32)1L << ( shift - 1 );


        vec->x = ( v.x + half - ( v.x < 0 ) ) >> shift;
        vec->y = ( v.y + half - ( v.y < 0 ) ) >> shift;
    }
    else
    {
        shift  = -shift;
        vec->x = (PVG_FT_Pos)( (PVG_FT_ULong)v.x << shift );
        vec->y = (PVG_FT_Pos)( (PVG_FT_ULong)v.y << shift );
    }
}